

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedInterfaceResourceBasicBlockTypes
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,Storage storage,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *blockContentGenerator)

{
  ProgramInterface PVar1;
  Program *this;
  Shader *this_00;
  Node *ptr;
  StorageQualifier *this_01;
  LayoutQualifier *this_02;
  InterfaceBlock *pIVar2;
  Variable *pVVar3;
  ArrayElement *pAVar4;
  SharedPtr dummyVariable;
  SharedPtr block;
  SharedPtr dummyVariable_2;
  SharedPtr binding;
  SharedPtr storageQualifier;
  SharedPtr defaultBlock;
  SharedPtr shader;
  SharedPtr program;
  
  this = (Program *)operator_new(0x28);
  ResourceDefinition::Program::Program(this,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&program,(Node *)this);
  this_00 = (Shader *)operator_new(0x28);
  ResourceDefinition::Shader::Shader(this_00,&program,SHADERTYPE_COMPUTE,glslVersion);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&shader,(Node *)this_00);
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)ptr,&shader);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&defaultBlock,ptr);
  this_01 = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this_01,&defaultBlock,storage);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&storageQualifier,(Node *)this_01);
  this_02 = (LayoutQualifier *)operator_new(0x38);
  glu::Layout::Layout((Layout *)&block,-1,1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  ResourceDefinition::LayoutQualifier::LayoutQualifier(this_02,&storageQualifier,(Layout *)&block);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&binding,(Node *)this_02);
  PVar1 = PROGRAMINTERFACE_SHADER_STORAGE_BLOCK;
  if (storage == STORAGE_UNIFORM) {
    PVar1 = PROGRAMINTERFACE_UNIFORM_BLOCK;
  }
  pIVar2 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar2,&binding,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&block,(Node *)pIVar2);
  pVVar3 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar3,&block,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable,(Node *)pVVar3);
  (*blockContentGenerator)(context,&dummyVariable,targetGroup,PVar1,"named_block");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&block);
  pIVar2 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar2,&binding,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&block,(Node *)pIVar2);
  pVVar3 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar3,&block,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable,(Node *)pVVar3);
  (*blockContentGenerator)(context,&dummyVariable,targetGroup,PVar1,"unnamed_block");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&block);
  pAVar4 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&binding,3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&block,(Node *)pAVar4);
  pIVar2 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar2,&block,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable,(Node *)pIVar2);
  pVVar3 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar3,&dummyVariable,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable_2,(Node *)pVVar3);
  (*blockContentGenerator)(context,&dummyVariable_2,targetGroup,PVar1,"block_array");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable_2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&block);
  pAVar4 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&binding,1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&block,(Node *)pAVar4);
  pIVar2 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar2,&block,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable,(Node *)pIVar2);
  pVVar3 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar3,&dummyVariable,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&dummyVariable_2,(Node *)pVVar3);
  (*blockContentGenerator)(context,&dummyVariable_2,targetGroup,PVar1,"block_array_single_element");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable_2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&dummyVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&block);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&binding);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&storageQualifier);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&defaultBlock);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&shader);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&program);
  return;
}

Assistant:

static void generateBufferBackedInterfaceResourceBasicBlockTypes (Context& context, tcu::TestCaseGroup* targetGroup, glu::GLSLVersion glslVersion, glu::Storage storage, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, ProgramInterface interface, const char* blockName))
{
	const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
	const ResourceDefinition::Node::SharedPtr	shader				(new ResourceDefinition::Shader(program, glu::SHADERTYPE_COMPUTE, glslVersion));
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(shader));
	const ResourceDefinition::Node::SharedPtr	storageQualifier	(new ResourceDefinition::StorageQualifier(defaultBlock, storage));
	const ResourceDefinition::Node::SharedPtr	binding				(new ResourceDefinition::LayoutQualifier(storageQualifier, glu::Layout(-1, 1)));
	const ProgramInterface						programInterface	= (storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) : (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "named_block");
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "unnamed_block");
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array");
	}

	// .block_array_single_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 1));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array_single_element");
	}
}